

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ListColumnData::GetColumnSegmentInfo
          (ListColumnData *this,idx_t row_group_index,vector<unsigned_long,_true> *col_path,
          vector<duckdb::ColumnSegmentInfo,_true> *result)

{
  iterator __position;
  reference pvVar1;
  pointer pCVar2;
  unsigned_long local_80;
  void *local_78 [3];
  void *local_60 [3];
  void *local_48 [3];
  
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
             &col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnData::GetColumnSegmentInfo
            (&this->super_ColumnData,row_group_index,(vector<unsigned_long,_true> *)local_48,result)
  ;
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0]);
  }
  local_80 = 0;
  __position._M_current =
       (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)col_path,__position,
               &local_80);
  }
  else {
    *__position._M_current = 0;
    (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
             &col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnData::GetColumnSegmentInfo
            (&(this->validity).super_ColumnData,row_group_index,
             (vector<unsigned_long,_true> *)local_60,result);
  if (local_60[0] != (void *)0x0) {
    operator_delete(local_60[0]);
  }
  pvVar1 = vector<unsigned_long,_true>::back(col_path);
  *pvVar1 = 1;
  pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             &col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  (*pCVar2->_vptr_ColumnData[0x21])
            (pCVar2,row_group_index,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,result);
  if (local_78[0] != (void *)0x0) {
    operator_delete(local_78[0]);
  }
  return;
}

Assistant:

void ListColumnData::GetColumnSegmentInfo(duckdb::idx_t row_group_index, vector<duckdb::idx_t> col_path,
                                          vector<duckdb::ColumnSegmentInfo> &result) {
	ColumnData::GetColumnSegmentInfo(row_group_index, col_path, result);
	col_path.push_back(0);
	validity.GetColumnSegmentInfo(row_group_index, col_path, result);
	col_path.back() = 1;
	child_column->GetColumnSegmentInfo(row_group_index, col_path, result);
}